

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O1

void duckdb::QuantileOperation::
     Operation<duckdb::hugeint_t,duckdb::QuantileState<duckdb::hugeint_t,duckdb::QuantileStandardType>,duckdb::MedianAbsoluteDeviationOperation<duckdb::hugeint_t>>
               (QuantileState<duckdb::hugeint_t,_duckdb::QuantileStandardType> *state,
               hugeint_t *input,AggregateUnaryInput *aggr_input)

{
  pointer *pphVar1;
  iterator __position;
  hugeint_t local_18;
  
  local_18.lower = input->lower;
  local_18.upper = input->upper;
  __position._M_current =
       (state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
       super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
      super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>::
    _M_realloc_insert<duckdb::hugeint_t>
              ((vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_> *)state,__position,
               &local_18);
  }
  else {
    (__position._M_current)->lower = local_18.lower;
    (__position._M_current)->upper = local_18.upper;
    pphVar1 = &(state->v).super_vector<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>.
               super__Vector_base<duckdb::hugeint_t,_std::allocator<duckdb::hugeint_t>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *pphVar1 = *pphVar1 + 1;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &aggr_input) {
		state.AddElement(input, aggr_input.input);
	}